

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitShift(StackInterpreter *this)

{
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  size_t sVar2;
  uint8_t *puVar3;
  SmallIntegerValue SVar4;
  SmallIntegerValue SVar5;
  long lVar6;
  Oop b;
  Oop a;
  
  paVar1 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
  a.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar1[1].uintValue;
  b.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar1->uintValue;
  if ((SUB84(b.field_0.uintValue,0) & SUB84(a.field_0.uintValue,0) & 1) != 0) {
    sVar2 = this->pc;
    this->pc = sVar2 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar2);
    (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar1 + 2);
    SVar4 = Oop::decodeSmallInteger(&a);
    SVar5 = Oop::decodeSmallInteger(&b);
    lVar6 = SVar4 >> (-(byte)SVar5 & 0x3f);
    if (0 < SVar5) {
      lVar6 = SVar4 << ((byte)SVar5 & 0x3f);
    }
    puVar3 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar3 + -8;
    *(long *)(puVar3 + -8) = lVar6 * 2 + 1;
    return;
  }
  sendSpecialArgumentCount(this,BitShift,1);
  return;
}

Assistant:

void interpretSpecialMessageBitShift()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            auto result = ib > 0 ? ia << ib : ia >> (-ib);
            pushOop(Oop::encodeSmallInteger(result));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitShift, 1);
        }

    }